

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc2_cbc.c
# Opt level: O0

void RC2_decrypt(ulong *data,RC2_KEY *key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  RC2_INT *pRVar4;
  unsigned_long l;
  RC2_INT t;
  RC2_INT x3;
  RC2_INT x2;
  RC2_INT x1;
  RC2_INT x0;
  RC2_INT *p1;
  RC2_INT *p0;
  int n;
  int i;
  RC2_KEY *key_local;
  unsigned_long *d_local;
  
  x0 = (uint)*data & 0xffff;
  x1 = (RC2_INT)(*data >> 0x10);
  x2 = (uint)data[1] & 0xffff;
  x3 = (RC2_INT)(data[1] >> 0x10);
  n = 3;
  i = 5;
  p0 = key->data + 0x3f;
  while( true ) {
    do {
      x3 = ((((x3 << 0xb | x3 >> 5) & 0xffff) - (x0 & (x2 ^ 0xffffffff))) - (x1 & x2)) - *p0 &
           0xffff;
      uVar1 = ((((x2 & 7) << 0xd | x2 >> 3) - (x3 & (x1 ^ 0xffffffff))) - (x0 & x1)) - p0[-1];
      x2 = uVar1 & 0xffff;
      pRVar4 = p0 + -3;
      uVar2 = ((((x1 << 0xe | x1 >> 2) & 0xffff) - (x2 & (x0 ^ 0xffffffff))) - (x3 & x0)) - p0[-2];
      x1 = uVar2 & 0xffff;
      p0 = p0 + -4;
      uVar3 = ((((x0 & 1) << 0xf | x0 >> 1) - (x1 & (x3 ^ 0xffffffff))) - (x2 & x3)) - *pRVar4;
      x0 = uVar3 & 0xffff;
      i = i + -1;
    } while (i != 0);
    n = n + -1;
    if (n == 0) break;
    i = 5;
    if (n == 2) {
      i = 6;
    }
    uVar1 = x3 - key->data[uVar1 & 0x3f];
    x3 = uVar1 & 0xffff;
    x2 = x2 - key->data[uVar2 & 0x3f] & 0xffff;
    x1 = x1 - key->data[uVar3 & 0x3f] & 0xffff;
    x0 = x0 - key->data[uVar1 & 0x3f] & 0xffff;
  }
  *data = (ulong)x0 | (ulong)x1 << 0x10;
  data[1] = (ulong)x2 | (ulong)x3 << 0x10;
  return;
}

Assistant:

void RC2_decrypt(unsigned long *d, RC2_KEY *key)
{
    int i, n;
    register RC2_INT *p0, *p1;
    register RC2_INT x0, x1, x2, x3, t;
    unsigned long l;

    l = d[0];
    x0 = (RC2_INT) l & 0xffff;
    x1 = (RC2_INT) (l >> 16L);
    l = d[1];
    x2 = (RC2_INT) l & 0xffff;
    x3 = (RC2_INT) (l >> 16L);

    n = 3;
    i = 5;

    p0 = &(key->data[63]);
    p1 = &(key->data[0]);
    for (;;) {
        t = ((x3 << 11) | (x3 >> 5)) & 0xffff;
        x3 = (t - (x0 & ~x2) - (x1 & x2) - *(p0--)) & 0xffff;
        t = ((x2 << 13) | (x2 >> 3)) & 0xffff;
        x2 = (t - (x3 & ~x1) - (x0 & x1) - *(p0--)) & 0xffff;
        t = ((x1 << 14) | (x1 >> 2)) & 0xffff;
        x1 = (t - (x2 & ~x0) - (x3 & x0) - *(p0--)) & 0xffff;
        t = ((x0 << 15) | (x0 >> 1)) & 0xffff;
        x0 = (t - (x1 & ~x3) - (x2 & x3) - *(p0--)) & 0xffff;

        if (--i == 0) {
            if (--n == 0)
                break;
            i = (n == 2) ? 6 : 5;

            x3 = (x3 - p1[x2 & 0x3f]) & 0xffff;
            x2 = (x2 - p1[x1 & 0x3f]) & 0xffff;
            x1 = (x1 - p1[x0 & 0x3f]) & 0xffff;
            x0 = (x0 - p1[x3 & 0x3f]) & 0xffff;
        }
    }

    d[0] =
        (unsigned long)(x0 & 0xffff) | ((unsigned long)(x1 & 0xffff) << 16L);
    d[1] =
        (unsigned long)(x2 & 0xffff) | ((unsigned long)(x3 & 0xffff) << 16L);
}